

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O3

void helper_gvec_umin32_ppc64(void *d,void *a,void *b,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar1 = desc * 8 & 0xff;
  uVar2 = 0;
  do {
    uVar3 = *(uint *)((long)b + uVar2);
    if (*(uint *)((long)a + uVar2) < *(uint *)((long)b + uVar2)) {
      uVar3 = *(uint *)((long)a + uVar2);
    }
    *(uint *)((long)d + uVar2) = uVar3;
    uVar2 = uVar2 + 4;
  } while (uVar2 < uVar1 + 8);
  if ((desc >> 2 & 0xf8) <= uVar1) {
    return;
  }
  helper_gvec_umin32_ppc64_cold_1();
  return;
}

Assistant:

void HELPER(gvec_umin32)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint32_t)) {
        uint32_t aa = *(uint32_t *)((char *)a + i);
        uint32_t bb = *(uint32_t *)((char *)b + i);
        uint32_t dd = aa < bb ? aa : bb;
        *(uint32_t *)((char *)d + i) = dd;
    }
    clear_high(d, oprsz, desc);
}